

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTVariableExpression.cpp
# Opt level: O3

void __thiscall
MathML::AST::VariableExpression::VariableExpression(VariableExpression *this,String *name)

{
  pointer pcVar1;
  
  (this->super_INode)._vptr_INode = (_func_int **)&PTR__VariableExpression_009b6b38;
  (this->mName)._M_dataplus._M_p = (pointer)&(this->mName).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mName,pcVar1,pcVar1 + name->_M_string_length);
  this->mValue = (ConstantExpression *)0x0;
  return;
}

Assistant:

VariableExpression::VariableExpression( const String& name )
                : mName( name )
                , mValue( 0 )
        {}